

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

vector<cmsys::String,_std::allocator<cmsys::String>_> *
cmsys::SystemTools::SplitString
          (vector<cmsys::String,_std::allocator<cmsys::String>_> *__return_storage_ptr__,string *p,
          char sep,bool isPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string path;
  String local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  pcVar2 = (p->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + p->_M_string_length)
  ;
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48 != 0) {
    if ((isPath) && ((char)*local_50 == '/')) {
      std::__cxx11::string::_M_erase((ulong)&local_50,0);
      paVar1 = &local_90.super_string.field_2;
      local_90.super_string._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                (__return_storage_ptr__,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.super_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.super_string._M_dataplus._M_p,
                        local_90.super_string.field_2._M_allocated_capacity + 1);
      }
    }
    lVar3 = std::__cxx11::string::find((char)&local_50,(ulong)(uint)(int)sep);
    if (lVar3 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
        std::__cxx11::string::string((string *)&local_90,(string *)local_70,0,0xffffffffffffffff);
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                  (__return_storage_ptr__,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.super_string._M_dataplus._M_p != &local_90.super_string.field_2) {
          operator_delete(local_90.super_string._M_dataplus._M_p,
                          local_90.super_string.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        lVar3 = std::__cxx11::string::find((char)&local_50,(ulong)(uint)(int)sep);
      } while (lVar3 != -1);
    }
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_50);
    std::__cxx11::string::string((string *)&local_90,(string *)local_70,0,0xffffffffffffffff);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
              (__return_storage_ptr__,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.super_string._M_dataplus._M_p != &local_90.super_string.field_2) {
      operator_delete(local_90.super_string._M_dataplus._M_p,
                      local_90.super_string.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::vector<kwsys::String> SystemTools::SplitString(const kwsys_stl::string& p, char sep, bool isPath)
{
  kwsys_stl::string path = p;
  kwsys_stl::vector<kwsys::String> paths;
  if(path.empty())
    {
    return paths;
    }
  if(isPath && path[0] == '/')
    {
    path.erase(path.begin());
    paths.push_back("/");
    }
  kwsys_stl::string::size_type pos1 = 0;
  kwsys_stl::string::size_type pos2 = path.find(sep, pos1+1);
  while(pos2 != kwsys_stl::string::npos)
    {
    paths.push_back(path.substr(pos1, pos2-pos1));
    pos1 = pos2+1;
    pos2 = path.find(sep, pos1+1);
    }
  paths.push_back(path.substr(pos1, pos2-pos1));

  return paths;
}